

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall cmGraphVizWriter::WriteHeader(cmGraphVizWriter *this,cmGeneratedFileStream *str)

{
  ostream *poVar1;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)str,(this->GraphType)._M_dataplus._M_p,
                      (this->GraphType)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," \"",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->GraphName)._M_dataplus._M_p,(this->GraphName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" {",3);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)str,(this->GraphHeader)._M_dataplus._M_p,
                      (this->GraphHeader)._M_string_length);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void cmGraphVizWriter::WriteHeader(cmGeneratedFileStream& str) const
{
  str << this->GraphType << " \"" << this->GraphName << "\" {" << std::endl;
  str << this->GraphHeader << std::endl;
}